

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

void nn_xrep_rm(nn_sockbase *self,nn_pipe *pipe)

{
  void *ptr;
  
  ptr = nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)&self[2].sock,(nn_fq_data *)((long)ptr + 0x20));
  nn_hash_erase((nn_hash *)&self[1].sock,(nn_hash_item *)((long)ptr + 8));
  nn_hash_item_term((nn_hash_item *)((long)ptr + 8));
  nn_free(ptr);
  return;
}

Assistant:

void nn_xrep_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrep *xrep;
    struct nn_xrep_data *data;

    xrep = nn_cont (self, struct nn_xrep, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xrep->inpipes, &data->initem);
    nn_hash_erase (&xrep->outpipes, &data->outitem);
    nn_hash_item_term (&data->outitem);

    nn_free (data);
}